

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.h
# Opt level: O2

void __thiscall LinePrinter::~LinePrinter(LinePrinter *this)

{
  std::__cxx11::string::~string((string *)&this->output_buffer_);
  std::__cxx11::string::~string((string *)&this->line_buffer_);
  return;
}

Assistant:

bool is_smart_terminal() const { return smart_terminal_; }